

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_f16c.cpp
# Opt level: O2

void ncnn::innerproduct_fp16s_pack4_sse_f16c
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  void *pvVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  undefined1 (*pauVar20) [32];
  long lVar21;
  float *pfVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar32;
  float fVar44;
  float fVar45;
  __m128 pos;
  float fVar46;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  float fVar68;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  
  iVar16 = bottom_blob->elempack * bottom_blob->w;
  pvVar10 = bias_data->data;
  uVar17 = 0;
  uVar18 = (ulong)(uint)top_blob->w;
  if (top_blob->w < 1) {
    uVar18 = uVar17;
  }
  auVar67 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar81 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
  auVar23._8_4_ = 0x3f800000;
  auVar23._0_8_ = 0x3f8000003f800000;
  auVar23._12_4_ = 0x3f800000;
  do {
    if (uVar17 == uVar18) {
      return;
    }
    if (pvVar10 == (void *)0x0) {
      fVar24 = 0.0;
      fVar29 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
    }
    else {
      pfVar22 = (float *)((long)pvVar10 + uVar17 * 0x10);
      fVar24 = *pfVar22;
      fVar29 = pfVar22[1];
      fVar30 = pfVar22[2];
      fVar31 = pfVar22[3];
    }
    pauVar20 = (undefined1 (*) [32])
               (uVar17 * (long)weight_data_fp16->w * weight_data_fp16->elemsize +
               (long)weight_data_fp16->data);
    fVar74 = 0.0;
    fVar75 = 0.0;
    fVar68 = 0.0;
    fVar73 = 0.0;
    fVar76 = 0.0;
    fVar77 = 0.0;
    fVar78 = 0.0;
    lVar21 = 0;
    fVar91 = 0.0;
    fVar92 = 0.0;
    fVar89 = 0.0;
    fVar90 = 0.0;
    fVar93 = 0.0;
    fVar94 = 0.0;
    fVar95 = 0.0;
    fVar84 = 0.0;
    fVar85 = 0.0;
    fVar82 = 0.0;
    fVar83 = 0.0;
    fVar86 = 0.0;
    fVar87 = 0.0;
    fVar88 = 0.0;
    fVar45 = 0.0;
    fVar46 = 0.0;
    fVar32 = 0.0;
    fVar44 = 0.0;
    fVar47 = 0.0;
    fVar48 = 0.0;
    fVar49 = 0.0;
    pfVar22 = (float *)bottom_blob->data;
    for (iVar19 = 0; iVar19 + 7 < iVar16; iVar19 = iVar19 + 8) {
      fVar1 = *pfVar22;
      fVar2 = pfVar22[1];
      fVar3 = pfVar22[2];
      fVar4 = pfVar22[3];
      fVar5 = pfVar22[4];
      fVar6 = pfVar22[5];
      fVar7 = pfVar22[6];
      fVar8 = pfVar22[7];
      auVar11 = vlddqu_avx(*pauVar20);
      auVar12 = vlddqu_avx(pauVar20[1]);
      auVar13 = vcvtph2ps_f16c(auVar11._0_16_);
      auVar11 = vcvtph2ps_f16c(auVar11._16_16_);
      auVar14 = vcvtph2ps_f16c(auVar12._0_16_);
      auVar12 = vcvtph2ps_f16c(auVar12._16_16_);
      fVar32 = auVar13._0_4_ * fVar1 + fVar32;
      fVar44 = auVar13._4_4_ * fVar1 + fVar44;
      fVar45 = auVar13._8_4_ * fVar1 + fVar45;
      fVar46 = auVar13._12_4_ * fVar1 + fVar46;
      fVar47 = auVar13._16_4_ * fVar2 + fVar47;
      fVar48 = auVar13._24_4_ * fVar2 + fVar48;
      fVar49 = fVar2 + fVar49;
      fVar82 = fVar82 + auVar11._0_4_ * fVar3;
      fVar83 = fVar83 + auVar11._4_4_ * fVar3;
      fVar84 = fVar84 + auVar11._8_4_ * fVar3;
      fVar85 = fVar85 + auVar11._12_4_ * fVar3;
      fVar86 = fVar86 + auVar11._16_4_ * fVar4;
      fVar87 = fVar87 + auVar11._24_4_ * fVar4;
      fVar88 = fVar88 + fVar4;
      fVar89 = fVar5 * auVar14._0_4_ + fVar89;
      fVar90 = fVar5 * auVar14._4_4_ + fVar90;
      fVar91 = fVar5 * auVar14._8_4_ + fVar91;
      fVar92 = fVar5 * auVar14._12_4_ + fVar92;
      fVar93 = fVar6 * auVar14._16_4_ + fVar93;
      fVar94 = fVar6 * auVar14._24_4_ + fVar94;
      fVar95 = fVar6 + fVar95;
      fVar68 = fVar7 * auVar12._0_4_ + fVar68;
      fVar73 = fVar7 * auVar12._4_4_ + fVar73;
      fVar74 = fVar7 * auVar12._8_4_ + fVar74;
      fVar75 = fVar7 * auVar12._12_4_ + fVar75;
      fVar76 = fVar8 * auVar12._16_4_ + fVar76;
      fVar77 = fVar8 * auVar12._24_4_ + fVar77;
      fVar78 = fVar8 + fVar78;
      pfVar22 = pfVar22 + 8;
      pauVar20 = pauVar20 + 2;
      lVar21 = lVar21 + 8;
    }
    for (; iVar19 + 3 < iVar16; iVar19 = iVar19 + 4) {
      fVar1 = *pfVar22;
      fVar2 = pfVar22[1];
      fVar3 = pfVar22[2];
      fVar4 = pfVar22[3];
      auVar11 = vlddqu_avx(*pauVar20);
      auVar12 = vcvtph2ps_f16c(auVar11._0_16_);
      auVar11 = vcvtph2ps_f16c(auVar11._16_16_);
      fVar32 = auVar12._0_4_ * fVar1 + fVar32;
      fVar44 = auVar12._4_4_ * fVar1 + fVar44;
      fVar45 = auVar12._8_4_ * fVar1 + fVar45;
      fVar46 = auVar12._12_4_ * fVar1 + fVar46;
      fVar47 = auVar12._16_4_ * fVar2 + fVar47;
      fVar48 = auVar12._24_4_ * fVar2 + fVar48;
      fVar49 = fVar2 + fVar49;
      fVar82 = fVar82 + auVar11._0_4_ * fVar3;
      fVar83 = fVar83 + auVar11._4_4_ * fVar3;
      fVar84 = fVar84 + auVar11._8_4_ * fVar3;
      fVar85 = fVar85 + auVar11._12_4_ * fVar3;
      fVar86 = fVar86 + auVar11._16_4_ * fVar4;
      fVar87 = fVar87 + auVar11._24_4_ * fVar4;
      fVar88 = fVar88 + fVar4;
      pfVar22 = pfVar22 + 4;
      pauVar20 = pauVar20 + 1;
      lVar21 = lVar21 + 4;
    }
    for (; (int)lVar21 < iVar16; lVar21 = lVar21 + 1) {
      auVar52._8_8_ = 0;
      auVar52._0_8_ =
           *(ulong *)((long)weight_data_fp16->data +
                     lVar21 * 8 + weight_data_fp16->elemsize * uVar17 * (long)weight_data_fp16->w);
      auVar52 = vcvtph2ps_f16c(auVar52);
      fVar1 = *(float *)((long)bottom_blob->data + lVar21 * 4);
      fVar24 = fVar1 * auVar52._0_4_ + fVar24;
      fVar29 = fVar1 * auVar52._4_4_ + fVar29;
      fVar30 = fVar1 * auVar52._8_4_ + fVar30;
      fVar31 = fVar1 * auVar52._12_4_ + fVar31;
    }
    fVar44 = fVar90 + fVar73 + fVar83 + fVar44;
    auVar25._0_4_ = fVar93 + fVar76 + fVar86 + fVar47 + fVar89 + fVar68 + fVar82 + fVar32 + fVar24;
    auVar25._4_4_ = fVar44 + fVar44 + fVar29;
    auVar25._8_4_ = fVar94 + fVar77 + fVar87 + fVar48 + fVar91 + fVar74 + fVar84 + fVar45 + fVar30;
    auVar25._12_4_ = fVar95 + fVar78 + fVar88 + fVar49 + fVar92 + fVar75 + fVar85 + fVar46 + fVar31;
    auVar63 = auVar25;
    if (5 < activation_type - 1U) goto switchD_002fc7fb_caseD_1;
    auVar52 = auVar67._0_16_;
    auVar63 = vmaxps_avx(auVar25,auVar52);
    fVar24 = auVar81._0_4_;
    fVar29 = auVar81._4_4_;
    fVar30 = auVar81._8_4_;
    fVar31 = auVar81._12_4_;
    switch(activation_type) {
    case 2:
      auVar52 = vminps_avx(auVar25,auVar52);
      fVar24 = *activation_params->data;
      auVar33._0_4_ = fVar24 * auVar52._0_4_ + auVar63._0_4_;
      auVar33._4_4_ = fVar24 * auVar52._4_4_ + auVar63._4_4_;
      auVar33._8_4_ = fVar24 * auVar52._8_4_ + auVar63._8_4_;
      auVar33._12_4_ = fVar24 * auVar52._12_4_ + auVar63._12_4_;
      auVar63 = auVar33;
      break;
    case 3:
      uVar9 = *activation_params->data;
      auVar38._4_4_ = uVar9;
      auVar38._0_4_ = uVar9;
      auVar38._8_4_ = uVar9;
      auVar38._12_4_ = uVar9;
      uVar9 = *(undefined4 *)((long)activation_params->data + 4);
      auVar59._4_4_ = uVar9;
      auVar59._0_4_ = uVar9;
      auVar59._8_4_ = uVar9;
      auVar59._12_4_ = uVar9;
      auVar52 = vmaxps_avx(auVar25,auVar38);
      auVar63 = vminps_avx(auVar52,auVar59);
      break;
    case 4:
      uVar15 = CONCAT44(auVar25._4_4_,auVar25._0_4_);
      auVar26._0_8_ = uVar15 ^ 0x8000000080000000;
      auVar26._8_4_ = -auVar25._8_4_;
      auVar26._12_4_ = -auVar25._12_4_;
      auVar39._8_4_ = 0x42b0c0a5;
      auVar39._0_8_ = 0x42b0c0a542b0c0a5;
      auVar39._12_4_ = 0x42b0c0a5;
      auVar52 = vminps_avx(auVar26,auVar39);
      auVar40._8_4_ = 0xc2b0c0a5;
      auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar40._12_4_ = 0xc2b0c0a5;
      auVar25 = vmaxps_avx(auVar52,auVar40);
      auVar41._0_4_ = fVar24 + auVar25._0_4_ * 1.442695;
      auVar41._4_4_ = fVar29 + auVar25._4_4_ * 1.442695;
      auVar41._8_4_ = fVar30 + auVar25._8_4_ * 1.442695;
      auVar41._12_4_ = fVar31 + auVar25._12_4_ * 1.442695;
      auVar60._0_4_ = (int)auVar41._0_4_;
      auVar60._4_4_ = (int)auVar41._4_4_;
      auVar60._8_4_ = (int)auVar41._8_4_;
      auVar60._12_4_ = (int)auVar41._12_4_;
      auVar63 = vcvtdq2ps_avx(auVar60);
      auVar52 = vcmpps_avx(auVar41,auVar63,1);
      auVar52 = vandps_avx(auVar52,auVar23);
      auVar52 = vsubps_avx(auVar63,auVar52);
      fVar45 = auVar25._0_4_ + auVar52._0_4_ * -0.6931472;
      fVar46 = auVar25._4_4_ + auVar52._4_4_ * -0.6931472;
      fVar74 = auVar25._8_4_ + auVar52._8_4_ * -0.6931472;
      fVar75 = auVar25._12_4_ + auVar52._12_4_ * -0.6931472;
      auVar42._0_4_ = (int)auVar52._0_4_;
      auVar42._4_4_ = (int)auVar52._4_4_;
      auVar42._8_4_ = (int)auVar52._8_4_;
      auVar42._12_4_ = (int)auVar52._12_4_;
      auVar52 = vpslld_avx(auVar42,0x17);
      auVar52 = vpaddd_avx(auVar52,auVar23);
      auVar27._0_4_ =
           (fVar45 + 1.0 +
           fVar45 * fVar45 *
           (fVar24 + ((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                      0.041665796) * fVar45 + 0.16666666) * fVar45)) * auVar52._0_4_ + 1.0;
      auVar27._4_4_ =
           (fVar46 + 1.0 +
           fVar46 * fVar46 *
           (fVar29 + ((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                      0.041665796) * fVar46 + 0.16666666) * fVar46)) * auVar52._4_4_ + 1.0;
      auVar27._8_4_ =
           (fVar74 + 1.0 +
           fVar74 * fVar74 *
           (fVar30 + ((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                      0.041665796) * fVar74 + 0.16666666) * fVar74)) * auVar52._8_4_ + 1.0;
      auVar27._12_4_ =
           (fVar75 + 1.0 +
           fVar75 * fVar75 *
           (fVar31 + ((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                      0.041665796) * fVar75 + 0.16666666) * fVar75)) * auVar52._12_4_ + 1.0;
      auVar52 = vrcpps_avx(auVar27);
      fVar24 = auVar52._0_4_;
      auVar28._0_4_ = auVar27._0_4_ * fVar24;
      fVar29 = auVar52._4_4_;
      auVar28._4_4_ = auVar27._4_4_ * fVar29;
      fVar30 = auVar52._8_4_;
      auVar28._8_4_ = auVar27._8_4_ * fVar30;
      fVar31 = auVar52._12_4_;
      auVar28._12_4_ = auVar27._12_4_ * fVar31;
      auVar52 = vsubps_avx(auVar23,auVar28);
      auVar63._0_4_ = fVar24 + fVar24 * auVar52._0_4_;
      auVar63._4_4_ = fVar29 + fVar29 * auVar52._4_4_;
      auVar63._8_4_ = fVar30 + fVar30 * auVar52._8_4_;
      auVar63._12_4_ = fVar31 + fVar31 * auVar52._12_4_;
      break;
    case 5:
      auVar79._8_4_ = 0x42b0c0a5;
      auVar79._0_8_ = 0x42b0c0a542b0c0a5;
      auVar79._12_4_ = 0x42b0c0a5;
      auVar52 = vminps_avx(auVar79,auVar25);
      auVar80._8_4_ = 0xc2b0c0a5;
      auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar80._12_4_ = 0xc2b0c0a5;
      auVar37 = vmaxps_avx(auVar80,auVar52);
      auVar50._0_4_ = fVar24 + auVar37._0_4_ * 1.442695;
      auVar50._4_4_ = fVar29 + auVar37._4_4_ * 1.442695;
      auVar50._8_4_ = fVar30 + auVar37._8_4_ * 1.442695;
      auVar50._12_4_ = fVar31 + auVar37._12_4_ * 1.442695;
      auVar61._0_4_ = (int)auVar50._0_4_;
      auVar61._4_4_ = (int)auVar50._4_4_;
      auVar61._8_4_ = (int)auVar50._8_4_;
      auVar61._12_4_ = (int)auVar50._12_4_;
      auVar63 = vcvtdq2ps_avx(auVar61);
      auVar52 = vcmpps_avx(auVar50,auVar63,1);
      auVar52 = vandps_avx(auVar52,auVar23);
      auVar52 = vsubps_avx(auVar63,auVar52);
      auVar62._0_4_ = auVar52._0_4_ * 0.6931472;
      auVar62._4_4_ = auVar52._4_4_ * 0.6931472;
      auVar62._8_4_ = auVar52._8_4_ * 0.6931472;
      auVar62._12_4_ = auVar52._12_4_ * 0.6931472;
      auVar63 = vsubps_avx(auVar37,auVar62);
      fVar45 = auVar63._0_4_;
      fVar46 = auVar63._4_4_;
      fVar74 = auVar63._8_4_;
      fVar75 = auVar63._12_4_;
      auVar51._0_4_ = (int)auVar52._0_4_;
      auVar51._4_4_ = (int)auVar52._4_4_;
      auVar51._8_4_ = (int)auVar52._8_4_;
      auVar51._12_4_ = (int)auVar52._12_4_;
      auVar52 = vpslld_avx(auVar51,0x17);
      auVar52 = vpaddd_avx(auVar52,auVar23);
      auVar34._0_4_ =
           (fVar45 + 1.0 +
           fVar45 * fVar45 *
           (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
             0.041665796) * fVar45 + 0.16666666) * fVar45 + fVar24)) * auVar52._0_4_ + 1.0;
      auVar34._4_4_ =
           (fVar46 + 1.0 +
           fVar46 * fVar46 *
           (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
             0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar29)) * auVar52._4_4_ + 1.0;
      auVar34._8_4_ =
           (fVar74 + 1.0 +
           fVar74 * fVar74 *
           (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
             0.041665796) * fVar74 + 0.16666666) * fVar74 + fVar30)) * auVar52._8_4_ + 1.0;
      auVar34._12_4_ =
           (fVar75 + 1.0 +
           fVar75 * fVar75 *
           (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
             0.041665796) * fVar75 + 0.16666666) * fVar75 + fVar31)) * auVar52._12_4_ + 1.0;
      auVar53._8_4_ = 0x800000;
      auVar53._0_8_ = 0x80000000800000;
      auVar53._12_4_ = 0x800000;
      auVar52 = vmaxps_avx(auVar34,auVar53);
      auVar63 = vpsrld_avx(auVar52,0x17);
      auVar69._8_4_ = 0xffffff82;
      auVar69._0_8_ = 0xffffff82ffffff82;
      auVar69._12_4_ = 0xffffff82;
      auVar63 = vpaddd_avx(auVar63,auVar69);
      auVar70._8_4_ = 0x807fffff;
      auVar70._0_8_ = 0x807fffff807fffff;
      auVar70._12_4_ = 0x807fffff;
      auVar52 = vandps_avx(auVar52,auVar70);
      auVar43 = vorps_avx(auVar52,auVar81._0_16_);
      auVar37 = vcvtdq2ps_avx(auVar63);
      auVar71._8_4_ = 0x3f3504f3;
      auVar71._0_8_ = 0x3f3504f33f3504f3;
      auVar71._12_4_ = 0x3f3504f3;
      auVar63 = vcmpps_avx(auVar43,auVar71,1);
      auVar52 = vandps_avx(auVar63,auVar43);
      fVar45 = auVar52._0_4_ + auVar43._0_4_ + -1.0;
      fVar46 = auVar52._4_4_ + auVar43._4_4_ + -1.0;
      fVar74 = auVar52._8_4_ + auVar43._8_4_ + -1.0;
      fVar75 = auVar52._12_4_ + auVar43._12_4_ + -1.0;
      auVar52 = vandps_avx(auVar63,auVar23);
      auVar63 = vsubps_avx(auVar37,auVar52);
      auVar52 = vcmpps_avx(auVar34,_DAT_004c4990,2);
      auVar54._0_4_ =
           (auVar63._0_4_ * 0.6931472 + fVar45 +
           (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) * fVar45 +
                 -0.12420141) * fVar45 + 0.14249323) * fVar45 + -0.16668057) * fVar45 + 0.20000714)
              * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 + -0.5) * fVar45 * fVar45) *
           -2.0;
      auVar54._4_4_ =
           (auVar63._4_4_ * 0.6931472 + fVar46 +
           (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                 -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 + 0.20000714)
              * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5) * fVar46 * fVar46) *
           -2.0;
      auVar54._8_4_ =
           (auVar63._8_4_ * 0.6931472 + fVar74 +
           (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 + 0.116769984) * fVar74 +
                 -0.12420141) * fVar74 + 0.14249323) * fVar74 + -0.16668057) * fVar74 + 0.20000714)
              * fVar74 + -0.24999994) * fVar74 + 0.3333333) * fVar74 + -0.5) * fVar74 * fVar74) *
           -2.0;
      auVar54._12_4_ =
           (auVar63._12_4_ * 0.6931472 + fVar75 +
           (((((((((fVar75 * 0.070376836 + -0.1151461) * fVar75 + 0.116769984) * fVar75 +
                 -0.12420141) * fVar75 + 0.14249323) * fVar75 + -0.16668057) * fVar75 + 0.20000714)
              * fVar75 + -0.24999994) * fVar75 + 0.3333333) * fVar75 + -0.5) * fVar75 * fVar75) *
           -2.0;
      auVar64._8_4_ = 0x7fffffff;
      auVar64._0_8_ = 0x7fffffff7fffffff;
      auVar64._12_4_ = 0x7fffffff;
      auVar52 = vblendvps_avx(auVar54,auVar64,auVar52);
      auVar55._8_4_ = 0x42b0c0a5;
      auVar55._0_8_ = 0x42b0c0a542b0c0a5;
      auVar55._12_4_ = 0x42b0c0a5;
      auVar52 = vminps_avx(auVar52,auVar55);
      auVar56._8_4_ = 0xc2b0c0a5;
      auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar56._12_4_ = 0xc2b0c0a5;
      auVar37 = vmaxps_avx(auVar52,auVar56);
      auVar57._0_4_ = auVar37._0_4_ * 1.442695 + fVar24;
      auVar57._4_4_ = auVar37._4_4_ * 1.442695 + fVar29;
      auVar57._8_4_ = auVar37._8_4_ * 1.442695 + fVar30;
      auVar57._12_4_ = auVar37._12_4_ * 1.442695 + fVar31;
      auVar65._0_4_ = (int)auVar57._0_4_;
      auVar65._4_4_ = (int)auVar57._4_4_;
      auVar65._8_4_ = (int)auVar57._8_4_;
      auVar65._12_4_ = (int)auVar57._12_4_;
      auVar63 = vcvtdq2ps_avx(auVar65);
      auVar52 = vcmpps_avx(auVar57,auVar63,1);
      auVar52 = vandps_avx(auVar52,auVar23);
      auVar52 = vsubps_avx(auVar63,auVar52);
      auVar66._0_4_ = auVar52._0_4_ * 0.6931472;
      auVar66._4_4_ = auVar52._4_4_ * 0.6931472;
      auVar66._8_4_ = auVar52._8_4_ * 0.6931472;
      auVar66._12_4_ = auVar52._12_4_ * 0.6931472;
      auVar63 = vsubps_avx(auVar37,auVar66);
      fVar45 = auVar63._0_4_;
      fVar46 = auVar63._4_4_;
      fVar74 = auVar63._8_4_;
      fVar75 = auVar63._12_4_;
      auVar81 = ZEXT1664(auVar81._0_16_);
      auVar67 = ZEXT864(0) << 0x20;
      auVar58._0_4_ = (int)auVar52._0_4_;
      auVar58._4_4_ = (int)auVar52._4_4_;
      auVar58._8_4_ = (int)auVar52._8_4_;
      auVar58._12_4_ = (int)auVar52._12_4_;
      auVar52 = vpslld_avx(auVar58,0x17);
      auVar52 = vpaddd_avx(auVar52,auVar23);
      auVar35._0_4_ =
           (fVar45 + 1.0 +
           fVar45 * fVar45 *
           (fVar24 + ((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                      0.041665796) * fVar45 + 0.16666666) * fVar45)) * auVar52._0_4_ + 1.0;
      auVar35._4_4_ =
           (fVar46 + 1.0 +
           fVar46 * fVar46 *
           (fVar29 + ((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                      0.041665796) * fVar46 + 0.16666666) * fVar46)) * auVar52._4_4_ + 1.0;
      auVar35._8_4_ =
           (fVar74 + 1.0 +
           fVar74 * fVar74 *
           (fVar30 + ((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                      0.041665796) * fVar74 + 0.16666666) * fVar74)) * auVar52._8_4_ + 1.0;
      auVar35._12_4_ =
           (fVar75 + 1.0 +
           fVar75 * fVar75 *
           (fVar31 + ((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                      0.041665796) * fVar75 + 0.16666666) * fVar75)) * auVar52._12_4_ + 1.0;
      auVar52 = vrcpps_avx(auVar35);
      fVar24 = auVar52._0_4_;
      fVar29 = auVar52._4_4_;
      fVar30 = auVar52._8_4_;
      fVar31 = auVar52._12_4_;
      auVar36._0_4_ = auVar35._0_4_ * (fVar24 + fVar24);
      auVar36._4_4_ = auVar35._4_4_ * (fVar29 + fVar29);
      auVar36._8_4_ = auVar35._8_4_ * (fVar30 + fVar30);
      auVar36._12_4_ = auVar35._12_4_ * (fVar31 + fVar31);
      auVar72._8_4_ = 0x40000000;
      auVar72._0_8_ = 0x4000000040000000;
      auVar72._12_4_ = 0x40000000;
      auVar52 = vsubps_avx(auVar72,auVar36);
      auVar37._0_4_ = fVar24 + fVar24 + -1.0 + fVar24 * auVar52._0_4_;
      auVar37._4_4_ = fVar29 + fVar29 + -1.0 + fVar29 * auVar52._4_4_;
      auVar37._8_4_ = fVar30 + fVar30 + -1.0 + fVar30 * auVar52._8_4_;
      auVar37._12_4_ = fVar31 + fVar31 + -1.0 + fVar31 * auVar52._12_4_;
      goto LAB_002fcc25;
    case 6:
      fVar24 = *activation_params->data;
      fVar29 = *(float *)((long)activation_params->data + 4);
      auVar43._0_4_ = fVar24 * auVar25._0_4_ + fVar29;
      auVar43._4_4_ = fVar24 * auVar25._4_4_ + fVar29;
      auVar43._8_4_ = fVar24 * auVar25._8_4_ + fVar29;
      auVar43._12_4_ = fVar24 * auVar25._12_4_ + fVar29;
      auVar52 = vmaxps_avx(auVar43,auVar52);
      auVar37 = vminps_avx(auVar52,auVar23);
LAB_002fcc25:
      auVar63._0_4_ = auVar37._0_4_ * auVar25._0_4_;
      auVar63._4_4_ = auVar37._4_4_ * auVar25._4_4_;
      auVar63._8_4_ = auVar37._8_4_ * auVar25._8_4_;
      auVar63._12_4_ = auVar37._12_4_ * auVar25._12_4_;
    }
switchD_002fc7fb_caseD_1:
    *(undefined1 (*) [16])((long)top_blob->data + uVar17 * 0x10) = auVar63;
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void innerproduct_fp16s_pack4_sse_f16c(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    innerproduct_fp16s_pack4_sse(bottom_blob, top_blob, weight_data_fp16, bias_data, activation_type, activation_params, opt);
}